

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

bool __thiscall
slang::parsing::Parser::scanQualifiedName(Parser *this,uint32_t *index,bool allowNew)

{
  uint32_t uVar1;
  bool bVar2;
  TokenKind TVar3;
  Token TVar4;
  
  TVar4 = ParserBase::peek(&this->super_ParserBase,*index);
  TVar3 = TVar4.kind;
  if (((TVar3 == Identifier) || (TVar3 == UnitSystemName)) || (allowNew && TVar3 == NewKeyword)) {
    do {
      uVar1 = *index;
      *index = uVar1 + 1;
      TVar4 = ParserBase::peek(&this->super_ParserBase,uVar1 + 1);
      if (TVar4.kind == Hash) {
        uVar1 = *index;
        *index = uVar1 + 1;
        TVar4 = ParserBase::peek(&this->super_ParserBase,uVar1 + 1);
        if (TVar4.kind != OpenParenthesis) {
          return false;
        }
        *index = *index + 1;
        bVar2 = scanTypePart<&slang::syntax::SyntaxFacts::isNotInType>
                          (this,index,OpenParenthesis,CloseParenthesis);
        if (!bVar2) {
          return false;
        }
      }
      TVar4 = ParserBase::peek(&this->super_ParserBase,*index);
      if (TVar4.kind != DoubleColon) {
        return true;
      }
      uVar1 = *index;
      *index = uVar1 + 1;
      TVar4 = ParserBase::peek(&this->super_ParserBase,uVar1 + 1);
    } while (TVar4.kind == NewKeyword && allowNew || TVar4.kind == Identifier);
  }
  return false;
}

Assistant:

bool Parser::scanQualifiedName(uint32_t& index, bool allowNew) {
    auto next = peek(index);
    if (next.kind != TokenKind::Identifier && next.kind != TokenKind::UnitSystemName &&
        (!allowNew || next.kind != TokenKind::NewKeyword)) {
        return false;
    }

    while (true) {
        if (peek(++index).kind == TokenKind::Hash) {
            // scan parameter value assignment
            if (peek(++index).kind != TokenKind::OpenParenthesis)
                return false;

            index++;
            if (!scanTypePart<isNotInType>(index, TokenKind::OpenParenthesis,
                                           TokenKind::CloseParenthesis)) {
                return false;
            }
        }

        if (peek(index).kind != TokenKind::DoubleColon)
            break;

        next = peek(++index);
        if (next.kind != TokenKind::Identifier && (!allowNew || next.kind != TokenKind::NewKeyword))
            return false;
    }
    return true;
}